

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O2

string * __thiscall
benchmark::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,benchmark *this,char *flag)

{
  size_t i;
  long lVar1;
  string env_var;
  string flag_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  long local_30;
  
  std::__cxx11::string::string((string *)&local_38,(char *)this,(allocator *)&local_58);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  for (lVar1 = 0; lVar1 != local_30; lVar1 = lVar1 + 1) {
    toupper((int)*(char *)(local_38 + lVar1));
    std::__cxx11::string::push_back((char)&local_58);
  }
  std::operator+(__return_storage_ptr__,"BENCHMARK_",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string flag_str(flag);

  std::string env_var;
  for (size_t i = 0; i != flag_str.length(); ++i)
    env_var += static_cast<char>(::toupper(flag_str.c_str()[i]));

  return "BENCHMARK_" + env_var;
}